

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O2

SquareMatrix<3> *
pbrt::ConvertRGBColorSpace
          (SquareMatrix<3> *__return_storage_ptr__,RGBColorSpace *from,RGBColorSpace *to)

{
  bool bVar1;
  
  bVar1 = RGBColorSpace::operator==(from,to);
  if (bVar1) {
    SquareMatrix<3>::SquareMatrix(__return_storage_ptr__);
  }
  else {
    operator*(__return_storage_ptr__,&to->RGBFromXYZ,&from->XYZFromRGB);
  }
  return __return_storage_ptr__;
}

Assistant:

SquareMatrix<3> ConvertRGBColorSpace(const RGBColorSpace &from, const RGBColorSpace &to) {
    if (from == to)
        return {};
    return to.RGBFromXYZ * from.XYZFromRGB;
}